

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UnsafeArenaExtractSubrange
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  Nonnull<const_char_*> failure_msg;
  void **ppvVar1;
  int line;
  LogMessageFatal local_30;
  
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(start,0,"start >= 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(num,0,"num >= 0");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                              (num + start,(this->super_RepeatedPtrFieldBase).current_size_,
                               "start + num <= size()");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        if (0 < num) {
          if (elements != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0)
          {
            ppvVar1 = internal::RepeatedPtrFieldBase::elements(&this->super_RepeatedPtrFieldBase);
            memcpy(elements,ppvVar1 + start,(ulong)(uint)num << 3);
          }
          internal::RepeatedPtrFieldBase::CloseGap(&this->super_RepeatedPtrFieldBase,start,num);
          return;
        }
        return;
      }
      line = 0x5c0;
    }
    else {
      line = 0x5bf;
    }
  }
  else {
    line = 0x5be;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

inline void RepeatedPtrField<Element>::UnsafeArenaExtractSubrange(
    int start, int num, Element** elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  ABSL_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != nullptr) {
      memcpy(elements, data() + start, num * sizeof(Element*));
    }
    CloseGap(start, num);
  }
}